

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O0

void fec_group_print(fec_group_t *group)

{
  uint local_14;
  int i;
  fec_group_t *group_local;
  
  if (group != (fec_group_t *)0x0) {
    fprintf(_stderr,"Group %p tstamp: %lu\n",group,group->tstamp);
    fprintf(_stderr,"k: %d, n: %d, len: %u\n",(ulong)group->fec_k,(ulong)group->fec_n,
            (ulong)group->fec_len);
    fprintf(_stderr,"received packets: %u/%u\n",(ulong)group->rcvd_pkts,(ulong)group->fec_k);
    for (local_14 = 0; (int)local_14 < (int)(uint)group->fec_n; local_14 = local_14 + 1) {
      if (group->lengths[(int)local_14] == 0) {
        fprintf(_stderr,"%d: not received\n",(ulong)local_14);
      }
      else {
        fprintf(_stderr,"%d: received\n",(ulong)local_14);
      }
    }
    return;
  }
  __assert_fail("group != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x53,
                "void fec_group_print(fec_group_t *)");
}

Assistant:

void fec_group_print(fec_group_t *group) {
  assert(group != NULL);
  
  fprintf(stderr, "Group %p tstamp: %lu\n", group, group->tstamp);
  fprintf(stderr, "k: %d, n: %d, len: %u\n",
          group->fec_k, group->fec_n, group->fec_len);
  
  fprintf(stderr, "received packets: %u/%u\n",
          group->rcvd_pkts, group->fec_k);

  int i;
  for (i = 0; i < group->fec_n; i++) {
    if (group->lengths[i] == 0) {
      fprintf(stderr, "%d: not received\n", i);
    } else {
      fprintf(stderr, "%d: received\n", i);
    }
  }
}